

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

int Sfm_DecPeformDec3(Sfm_Dec_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  uint Id;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  Mio_Gate_t *pGate;
  Mio_Gate_t *pGate_00;
  char *pFans1_00;
  abctime aVar7;
  bool bVar8;
  double dVar9;
  double local_12a0;
  int Delay;
  int Gain;
  Vec_Int_t vFanins;
  char *pFans2;
  char *pFans1;
  int AreaNew;
  Mio_Gate_t *pGate2;
  Mio_Gate_t *pGate1;
  abctime clk;
  char *pFans2Best;
  char *pFans1Best;
  Mio_Gate_t *pGate2Best;
  Mio_Gate_t *pGate1Best;
  int Prev;
  int RetValue;
  int iBest;
  int nMatches;
  int AreaMffc;
  int GainMax;
  int DelayMin;
  int DelayOrig;
  int k;
  int i;
  int nDecs;
  int fVeryVerbose;
  int pAssump [1000];
  int nSupp [4];
  int pSupp [4] [16];
  word Masks [2] [8];
  word uTruth [4] [4];
  Abc_Obj_t *pObj_local;
  Sfm_Dec_t *p_local;
  
  bVar8 = true;
  if (p->pPars->fPrintDecs == 0) {
    bVar8 = p->pPars->fVeryVerbose != 0;
  }
  iVar1 = Abc_MaxInt(p->pPars->nDecMax,1);
  Prev = -1;
  pGate1Best._0_4_ = 0;
  pGate2Best = (Mio_Gate_t *)0x0;
  pFans1Best = (char *)0x0;
  pFans2Best = (char *)0x0;
  clk = 0;
  if (p->pPars->fArea != 0) {
    __assert_fail("p->pPars->fArea == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                  ,0x4bf,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  p->DelayMin = 0;
  if (bVar8) {
    printf("\nNode %4d : MFFC %2d\n",(ulong)(uint)p->iTarget,(ulong)(uint)p->nMffc);
  }
  if (4 < p->pPars->nDecMax) {
    __assert_fail("p->pPars->nDecMax <= SFM_DEC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                  ,0x4c5,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  Sfm_ObjSetupSimInfo(pObj);
  Vec_IntClear(&p->vObjDec);
  DelayOrig = 0;
  do {
    if (iVar1 <= DelayOrig) {
      Sfm_ObjSetdownSimInfo(pObj);
      if (Prev == -1) {
        if (bVar8) {
          printf("Best  : NO DEC.\n");
        }
        p->nNoDecs = p->nNoDecs + 1;
        p_local._4_4_ = -2;
      }
      else {
        if (bVar8) {
          printf("Best %d: %d  ",(ulong)(uint)Prev,(ulong)(uint)pAssump[(long)Prev + 0x3e6]);
        }
        iVar1 = Sfm_LibImplementGatesDelay
                          (p->pLib,pSupp[(long)Prev + -1] + 0xe,pGate2Best,(Mio_Gate_t *)pFans1Best,
                           pFans2Best,(char *)clk,&p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < pAssump[(long)Prev + 0x3e6]) {
          __assert_fail("nSupp[iBest] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                        ,0x539,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[pAssump[(long)Prev + 0x3e6]] =
             p->nLuckySizes[pAssump[(long)Prev + 0x3e6]] + 1;
        if (2 < iVar1) {
          __assert_fail("RetValue <= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                        ,0x53b,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckyGates[iVar1] = p->nLuckyGates[iVar1] + 1;
        p->DelayMin = AreaMffc;
        p_local._4_4_ = 1;
      }
      return p_local._4_4_;
    }
    nMatches = 0;
    Id = Abc_ObjId(pObj);
    AreaMffc = Sfm_ManReadObjDelay(p,Id);
    iVar2 = Vec_IntSize(&p->vObjDec);
    if ((int)pGate1Best < iVar2) {
      Vec_IntShrink(&p->vObjDec,(int)pGate1Best);
    }
    iVar2 = Vec_IntSize(&p->vObjDec);
    pGate1Best._0_4_ = iVar2 + 1;
    Abc_TtMask((word *)(pSupp[3] + 0xe),8,p->nPats[0]);
    Abc_TtMask(Masks[0] + 7,8,p->nPats[1]);
    iVar2 = Sfm_DecPeformDec_rec
                      (p,uTruth[(long)DelayOrig + -1] + 3,pSupp[(long)DelayOrig + -1] + 0xe,&nDecs,0
                       ,(word (*) [8])(pSupp[3] + 0xe),1,0);
    pAssump[(long)DelayOrig + 0x3e6] = iVar2;
    if (pAssump[(long)DelayOrig + 0x3e6] == -2) {
      if (bVar8) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n",(ulong)(uint)DelayOrig,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
      }
    }
    else {
      if (bVar8) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ",(ulong)(uint)DelayOrig,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
        Dau_DsdPrintFromTruth(uTruth[(long)DelayOrig + -1] + 3,pAssump[(long)DelayOrig + 0x3e6]);
      }
      if (((p->pTim != (Sfm_Tim_t *)0x0) && (pAssump[(long)DelayOrig + 0x3e6] == 1)) &&
         (uTruth[(long)DelayOrig + -1][3] == 0x5555555555555555)) {
        iVar2 = p->DelayInv;
        iVar3 = Vec_IntEntry(&p->vObjMap,pSupp[(long)DelayOrig + -1][0xe]);
        iVar3 = Sfm_ManReadObjDelay(p,iVar3);
        if (AreaMffc <= iVar2 + iVar3) {
          if (bVar8) {
            printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n",(ulong)(uint)DelayOrig,
                   (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
          }
          goto LAB_0065d822;
        }
      }
      if (((p->pMit == (Sfm_Mit_t *)0x0) || (pAssump[(long)DelayOrig + 0x3e6] != 1)) ||
         (uTruth[(long)DelayOrig + -1][3] != 0x5555555555555555)) {
        if (pAssump[(long)DelayOrig + 0x3e6] < 2) {
          p->nSuppVars = pAssump[(long)DelayOrig + 0x3e6];
          Abc_TtCopy(p->Copy,uTruth[(long)DelayOrig + -1] + 3,4,0);
          iVar1 = Sfm_LibImplementSimple
                            (p->pLib,uTruth[(long)DelayOrig + -1] + 3,
                             pSupp[(long)DelayOrig + -1] + 0xe,pAssump[(long)DelayOrig + 0x3e6],
                             &p->vObjGates,&p->vObjFanins);
          if (p->pPars->nVarMax < pAssump[(long)DelayOrig + 0x3e6]) {
            __assert_fail("nSupp[i] <= p->pPars->nVarMax",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                          ,0x4ef,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
          }
          p->nLuckySizes[pAssump[(long)DelayOrig + 0x3e6]] =
               p->nLuckySizes[pAssump[(long)DelayOrig + 0x3e6]] + 1;
          if (iVar1 < 3) {
            p->nLuckyGates[iVar1] = p->nLuckyGates[iVar1] + 1;
            return iVar1;
          }
          __assert_fail("RetValue <= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                        ,0x4f1,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        Sfm_DecPrepareVec(&p->vObjMap,pSupp[(long)DelayOrig + -1] + 0xe,
                          pAssump[(long)DelayOrig + 0x3e6],&p->vGateCut);
        iVar2 = Sfm_DecMffcAreaReal(pObj,&p->vGateCut,&p->vGateMffc);
        p->nSuppVars = pAssump[(long)DelayOrig + 0x3e6];
        Abc_TtCopy(p->Copy,uTruth[(long)DelayOrig + -1] + 3,4,0);
        iVar3 = Sfm_LibFindDelayMatches
                          (p->pLib,uTruth[(long)DelayOrig + -1] + 3,
                           pSupp[(long)DelayOrig + -1] + 0xe,pAssump[(long)DelayOrig + 0x3e6],
                           &p->vMatchGates,&p->vMatchFans);
        for (DelayMin = 0; DelayMin < iVar3; DelayMin = DelayMin + 1) {
          aVar6 = Abc_Clock();
          pGate = (Mio_Gate_t *)Vec_PtrEntry(&p->vMatchGates,DelayMin << 1);
          pGate_00 = (Mio_Gate_t *)Vec_PtrEntry(&p->vMatchGates,DelayMin * 2 + 1);
          dVar9 = Mio_GateReadArea(pGate);
          if (pGate_00 == (Mio_Gate_t *)0x0) {
            local_12a0 = 0.0;
          }
          else {
            local_12a0 = Mio_GateReadArea(pGate_00);
          }
          iVar4 = Scl_Flt2Int((float)(dVar9 + local_12a0));
          pFans1_00 = (char *)Vec_PtrEntry(&p->vMatchFans,DelayMin << 1);
          vFanins.pArray = (int *)Vec_PtrEntry(&p->vMatchFans,DelayMin * 2 + 1);
          Delay = pAssump[(long)DelayOrig + 0x3e6];
          Gain = pAssump[(long)DelayOrig + 0x3e6];
          vFanins._0_8_ = pSupp[(long)DelayOrig + -1] + 0xe;
          if (p->pMit == (Sfm_Mit_t *)0x0) {
            iVar5 = Sfm_TimEvalRemapping
                              (p->pTim,(Vec_Int_t *)&Delay,&p->vObjMap,pGate,pFans1_00,pGate_00,
                               (char *)vFanins.pArray);
            if (((p->pPars->DelAreaRatio == 0) || (iVar4 <= iVar2)) ||
               (p->pPars->DelAreaRatio <= iVar5 / (iVar4 - iVar2))) {
              if (iVar5 < AreaMffc) {
                clk = (abctime)vFanins.pArray;
                Prev = DelayOrig;
                pFans2Best = pFans1_00;
                pFans1Best = (char *)pGate_00;
                pGate2Best = pGate;
                AreaMffc = iVar5;
              }
              goto LAB_0065d7eb;
            }
          }
          else {
            iVar5 = Sfm_MitEvalRemapping
                              (p->pMit,&p->vGateMffc,pObj,(Vec_Int_t *)&Delay,&p->vObjMap,pGate,
                               pFans1_00,pGate_00,(char *)vFanins.pArray);
            if (((p->pPars->DelAreaRatio == 0) || (iVar4 <= iVar2)) ||
               (p->pPars->DelAreaRatio <= iVar5 / (iVar4 - iVar2))) {
              if (nMatches < iVar5) {
                clk = (abctime)vFanins.pArray;
                Prev = DelayOrig;
                pFans2Best = pFans1_00;
                pFans1Best = (char *)pGate_00;
                pGate2Best = pGate;
                nMatches = iVar5;
              }
LAB_0065d7eb:
              aVar7 = Abc_Clock();
              p->timeEval = (aVar7 - aVar6) + p->timeEval;
            }
          }
        }
      }
      else if (bVar8) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n",(ulong)(uint)DelayOrig,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
      }
    }
LAB_0065d822:
    DelayOrig = DelayOrig + 1;
  } while( true );
}

Assistant:

int Sfm_DecPeformDec3( Sfm_Dec_t * p, Abc_Obj_t * pObj )
{
    word uTruth[SFM_DEC_MAX][SFM_WORD_MAX], Masks[2][SFM_SIM_WORDS];
    int pSupp[SFM_DEC_MAX][2*SFM_SUPP_MAX];
    int nSupp[SFM_DEC_MAX], pAssump[SFM_WIN_MAX];
    int fVeryVerbose = p->pPars->fPrintDecs || p->pPars->fVeryVerbose;
    int nDecs = Abc_MaxInt(p->pPars->nDecMax, 1);
    int i, k, DelayOrig = 0, DelayMin, GainMax, AreaMffc, nMatches, iBest = -1, RetValue, Prev = 0; 
    Mio_Gate_t * pGate1Best = NULL, * pGate2Best = NULL; 
    char * pFans1Best = NULL, * pFans2Best = NULL;
    assert( p->pPars->fArea == 0 );
    p->DelayMin = 0;
    //Sfm_DecPrint( p, NULL );
    if ( fVeryVerbose )
        printf( "\nNode %4d : MFFC %2d\n", p->iTarget, p->nMffc );
    // set limit on search for decompositions in delay-model
    assert( p->pPars->nDecMax <= SFM_DEC_MAX );
    Sfm_ObjSetupSimInfo( pObj );
    Vec_IntClear( &p->vObjDec );
    for ( i = 0; i < nDecs; i++ )
    {
        GainMax = 0;
        DelayMin = DelayOrig = Sfm_ManReadObjDelay( p, Abc_ObjId(pObj) );
        // reduce the variable array
        if ( Vec_IntSize(&p->vObjDec) > Prev )
            Vec_IntShrink( &p->vObjDec, Prev );
        Prev = Vec_IntSize(&p->vObjDec) + 1;
        // perform decomposition 
        Abc_TtMask( Masks[0], SFM_SIM_WORDS, p->nPats[0] );
        Abc_TtMask( Masks[1], SFM_SIM_WORDS, p->nPats[1] );        
        nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], pSupp[i], pAssump, 0, Masks, 1, 0 );
        if ( nSupp[i] == -2 )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( fVeryVerbose )
            printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ", i, p->nPats[0], p->nPats[1], nSupp[i] );
        if ( fVeryVerbose )
            Dau_DsdPrintFromTruth( uTruth[i], nSupp[i] );
        if ( p->pTim && nSupp[i] == 1 && uTruth[i][0] == ABC_CONST(0x5555555555555555) && DelayMin <= p->DelayInv + Sfm_ManReadObjDelay(p, Vec_IntEntry(&p->vObjMap, pSupp[i][0])) )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( p->pMit && nSupp[i] == 1 && uTruth[i][0] == ABC_CONST(0x5555555555555555) )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( nSupp[i] < 2 )
        {
            p->nSuppVars = nSupp[i];
            Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
            RetValue = Sfm_LibImplementSimple( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vObjGates, &p->vObjFanins );
            assert( nSupp[i] <= p->pPars->nVarMax );
            p->nLuckySizes[nSupp[i]]++;
            assert( RetValue <= 2 );
            p->nLuckyGates[RetValue]++;
            return RetValue;
        }

        // get MFFC
        Sfm_DecPrepareVec( &p->vObjMap, pSupp[i], nSupp[i], &p->vGateCut ); // returns cut in p->vGateCut
        AreaMffc = Sfm_DecMffcAreaReal(pObj, &p->vGateCut, &p->vGateMffc ); // returns MFFC in p->vGateMffc

        // try the delay
        p->nSuppVars = nSupp[i];
        Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
        nMatches = Sfm_LibFindDelayMatches( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vMatchGates, &p->vMatchFans );
        for ( k = 0; k < nMatches; k++ )
        {
            abctime clk = Abc_Clock();
            Mio_Gate_t * pGate1 = (Mio_Gate_t *)Vec_PtrEntry( &p->vMatchGates, 2*k+0 );
            Mio_Gate_t * pGate2 = (Mio_Gate_t *)Vec_PtrEntry( &p->vMatchGates, 2*k+1 );
            int AreaNew = Scl_Flt2Int( Mio_GateReadArea(pGate1) + (pGate2 ? Mio_GateReadArea(pGate2) : 0.0) );
            char * pFans1 = (char *)Vec_PtrEntry( &p->vMatchFans, 2*k+0 );
            char * pFans2 = (char *)Vec_PtrEntry( &p->vMatchFans, 2*k+1 );
            Vec_Int_t vFanins = { nSupp[i], nSupp[i], pSupp[i] };
            // skip identical gate
            //if ( pGate2 == NULL && pGate1 == (Mio_Gate_t *)pObj->pData )
            //    continue;
            if ( p->pMit )
            {
                int Gain = Sfm_MitEvalRemapping( p->pMit, &p->vGateMffc, pObj, &vFanins, &p->vObjMap, pGate1, pFans1, pGate2, pFans2 );
                if ( p->pPars->DelAreaRatio && AreaNew > AreaMffc && (Gain / (AreaNew - AreaMffc)) < p->pPars->DelAreaRatio )
                    continue;
                if ( GainMax < Gain )
                {
                    GainMax    = Gain;
                    pGate1Best = pGate1;
                    pGate2Best = pGate2;
                    pFans1Best = pFans1;
                    pFans2Best = pFans2;
                    iBest      = i;
                }
            }
            else
            {
                int Delay = Sfm_TimEvalRemapping( p->pTim, &vFanins, &p->vObjMap, pGate1, pFans1, pGate2, pFans2 );
                if ( p->pPars->DelAreaRatio && AreaNew > AreaMffc && (Delay / (AreaNew - AreaMffc)) < p->pPars->DelAreaRatio )
                    continue;
                if ( DelayMin > Delay )
                {
                    DelayMin   = Delay;
                    pGate1Best = pGate1;
                    pGate2Best = pGate2;
                    pFans1Best = pFans1;
                    pFans2Best = pFans2;
                    iBest      = i;
                }
            }
            p->timeEval += Abc_Clock() - clk;
        }
    }
//printf( "Gain max = %d.\n", GainMax );
    Sfm_ObjSetdownSimInfo( pObj );
    if ( iBest == -1 )
    {
        if ( fVeryVerbose )
            printf( "Best  : NO DEC.\n" );
        p->nNoDecs++;
        return -2;
    }
    if ( fVeryVerbose )
        printf( "Best %d: %d  ", iBest, nSupp[iBest] );
//    if ( fVeryVerbose )
//        Dau_DsdPrintFromTruth( uTruth[iBest], nSupp[iBest] );
    RetValue = Sfm_LibImplementGatesDelay( p->pLib, pSupp[iBest], pGate1Best, pGate2Best, pFans1Best, pFans2Best, &p->vObjGates, &p->vObjFanins );
    assert( nSupp[iBest] <= p->pPars->nVarMax );
    p->nLuckySizes[nSupp[iBest]]++;
    assert( RetValue <= 2 );
    p->nLuckyGates[RetValue]++;
    p->DelayMin = DelayMin;
    return 1;
}